

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crc.cc
# Opt level: O1

bool __thiscall
my_crc_basic::calc_crc
          (my_crc_basic *this,value_type use_initial,
          dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_> *msg,value_type expected_crc
          ,FEED_TYPE feed_type)

{
  uint uVar1;
  bool bVar2;
  value_type vVar3;
  uint uVar4;
  ulong uVar5;
  size_type pos;
  long lVar6;
  
  this->rem_ = use_initial;
  if ((feed_type == AUTO) && (feed_type = LINEAR_FORWARD, this->rft_in_ == true)) {
    feed_type = ((msg->m_num_bits & 7) == 0) + LINEAR_REVERSED;
  }
  if (feed_type == LINEAR_FORWARD) {
    if (msg->m_num_bits != 0) {
      pos = 0;
      do {
        bVar2 = boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>::test(msg,pos);
        uVar4 = this->high_bit_mask;
        if (!bVar2) {
          uVar4 = 0;
        }
        uVar4 = uVar4 ^ this->rem_;
        uVar1 = uVar4 * 2;
        this->rem_ = uVar1;
        if ((uVar4 & this->high_bit_mask) != 0) {
          this->rem_ = uVar1 ^ this->poly_;
        }
        pos = pos + 1;
      } while (pos < msg->m_num_bits);
    }
  }
  else if (feed_type == LINEAR_REVERSED) {
    uVar4 = (int)msg->m_num_bits - 1;
    if (-1 < (int)uVar4) {
      uVar5 = (ulong)uVar4;
      do {
        bVar2 = boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>::test
                          (msg,uVar5);
        uVar4 = this->high_bit_mask;
        if (!bVar2) {
          uVar4 = 0;
        }
        uVar4 = uVar4 ^ this->rem_;
        uVar1 = uVar4 * 2;
        this->rem_ = uVar1;
        if ((uVar4 & this->high_bit_mask) != 0) {
          this->rem_ = uVar1 ^ this->poly_;
        }
        bVar2 = 0 < (long)uVar5;
        uVar5 = uVar5 - 1;
      } while (bVar2);
    }
  }
  else if ((feed_type == BYTEWISE_REVERSED) && (msg->m_num_bits != 0)) {
    uVar5 = 0;
    do {
      lVar6 = 7;
      do {
        bVar2 = boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>::test
                          (msg,uVar5 + lVar6);
        uVar4 = this->high_bit_mask;
        if (!bVar2) {
          uVar4 = 0;
        }
        uVar4 = uVar4 ^ this->rem_;
        uVar1 = uVar4 * 2;
        this->rem_ = uVar1;
        if ((uVar4 & this->high_bit_mask) != 0) {
          this->rem_ = uVar1 ^ this->poly_;
        }
        bVar2 = lVar6 != 0;
        lVar6 = lVar6 + -1;
      } while (bVar2);
      uVar5 = uVar5 + 8;
    } while (uVar5 < msg->m_num_bits);
  }
  vVar3 = checksum(this);
  return vVar3 == expected_crc;
}

Assistant:

bool my_crc_basic::calc_crc(value_type const use_initial,
			    boost::dynamic_bitset<> const& msg,
			    value_type const expected_crc,
			    FEED_TYPE feed_type) {
  
  reset(use_initial);	


  if(feed_type == AUTO) {
    if(rft_in_) {
      if (msg.size() % 8 != 0) feed_type = LINEAR_REVERSED;
      else feed_type = BYTEWISE_REVERSED;
    }
    else {
      feed_type = LINEAR_FORWARD;
    }
  }


  
  if(feed_type == LINEAR_FORWARD) {
    for (size_t i = 0; i < msg.size(); i++) {
      process_bit(msg[i]);
    }
  }
  else if(feed_type == LINEAR_REVERSED) {
    for (int i = msg.size()-1; i >= 0; i--) {
      process_bit(msg[i]);
    }
  }
  else if(feed_type == BYTEWISE_REVERSED) {

      for(size_t i = 0; i < msg.size(); i+=8) {
	// inverse feeding
	for(int j = 1; j <= 8; j++)
	  process_bit(msg[i + 8 - j]);
      }
  }
  
  return checksum() == expected_crc;
}